

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_build_lights.cxx
# Opt level: O0

void __thiscall xray_re::xr_build_lights::load(xr_build_lights *this,xr_reader *r)

{
  bool bVar1;
  bool cs;
  bool bVar2;
  size_t sVar3;
  size_t size;
  uint32_t id;
  bool can_be_cs;
  bool can_be_soc;
  xr_reader *r_local;
  xr_build_lights *this_local;
  
  bVar2 = true;
  cs = true;
  for (size._0_4_ = 0; (uint)size < 3; size._0_4_ = (uint)size + 1) {
    sVar3 = xr_reader::find_chunk(r,(uint)size);
    if (sVar3 != 0) {
      if (sVar3 % 100 != 0) {
        bVar2 = false;
      }
      if (sVar3 % 0x68 != 0) {
        cs = false;
      }
    }
  }
  bVar1 = true;
  if (!bVar2) {
    bVar1 = cs;
  }
  if (bVar1 != false) {
    if ((bVar2) && (cs != false)) {
      msg("can\'t autodetect build.lights version");
    }
    else {
      read_lights(this,r,0,&this->m_rgb,cs);
      read_lights(this,r,1,&this->m_hemi,cs);
      read_lights(this,r,2,&this->m_sun,cs);
    }
    return;
  }
  __assert_fail("can_be_soc || can_be_cs",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_build_lights.cxx"
                ,0x19,"void xray_re::xr_build_lights::load(xr_reader &)");
}

Assistant:

void xr_build_lights::load(xr_reader& r)
{
	bool can_be_soc = true, can_be_cs = true;
	for (uint32_t id = BL_CHUNK_RGB; id <= BL_CHUNK_SUN; ++id) {
		if (size_t size = r.find_chunk(id)) {
			if (size % R_LIGHT_SIZE_SOC)
				can_be_soc = false;
			if (size % R_LIGHT_SIZE_CS)
				can_be_cs = false;
		}
	}
	xr_assert(can_be_soc || can_be_cs);
	if (can_be_soc && can_be_cs) {
		msg("can't autodetect build.lights version");
		return;
	}
	read_lights(r, BL_CHUNK_RGB, m_rgb, can_be_cs);
	read_lights(r, BL_CHUNK_HEMI, m_hemi, can_be_cs);
	read_lights(r, BL_CHUNK_SUN, m_sun, can_be_cs);
}